

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O3

QString * __thiscall
QFileInfoPrivate::getFileName(QString *__return_storage_ptr__,QFileInfoPrivate *this,FileName name)

{
  QAbstractFileEngine *pQVar1;
  char16_t *pcVar2;
  undefined1 *puVar3;
  Data *pDVar4;
  qsizetype qVar5;
  QArrayData *pQVar6;
  long in_FS_OFFSET;
  QFileSystemEntry entry;
  QString local_88;
  undefined1 local_68 [56];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)&this->field_0x1d8 < 0) {
    pcVar2 = this->fileNames[(int)name].d.ptr;
    if (pcVar2 != (char16_t *)0x0) {
      pDVar4 = this->fileNames[(int)name].d.d;
      (__return_storage_ptr__->d).d = pDVar4;
      (__return_storage_ptr__->d).ptr = pcVar2;
      (__return_storage_ptr__->d).size = this->fileNames[(int)name].d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00113443;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar1 = (this->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  if (pQVar1 != (QAbstractFileEngine *)0x0) {
    (*pQVar1->_vptr_QAbstractFileEngine[0x19])(local_68,pQVar1,(ulong)name);
    pQVar6 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_68._0_8_;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_68._8_8_;
    puVar3 = (undefined1 *)(__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_68._16_8_;
    local_68._0_8_ = pQVar6;
    local_68._8_8_ = pcVar2;
    local_68._16_8_ = puVar3;
    goto LAB_001133e9;
  }
  switch(name) {
  case AbsoluteName:
  case AbsolutePathName:
    local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEngine::absoluteName((QFileSystemEntry *)local_68,&this->fileEntry);
    if (*(int *)&this->field_0x1d8 < 0) {
      QFileSystemEntry::filePath(&local_88,(QFileSystemEntry *)local_68);
      pQVar6 = &(this->fileNames[3].d.d)->super_QArrayData;
      pcVar2 = this->fileNames[3].d.ptr;
      this->fileNames[3].d.d = local_88.d.d;
      this->fileNames[3].d.ptr = local_88.d.ptr;
      qVar5 = this->fileNames[3].d.size;
      this->fileNames[3].d.size = local_88.d.size;
      local_88.d.d = (Data *)pQVar6;
      local_88.d.ptr = pcVar2;
      local_88.d.size = qVar5;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
      QFileSystemEntry::path(&local_88,(QFileSystemEntry *)local_68);
      pQVar6 = &(this->fileNames[4].d.d)->super_QArrayData;
      pcVar2 = this->fileNames[4].d.ptr;
      this->fileNames[4].d.d = local_88.d.d;
      this->fileNames[4].d.ptr = local_88.d.ptr;
      qVar5 = this->fileNames[4].d.size;
      this->fileNames[4].d.size = local_88.d.size;
      local_88.d.d = (Data *)pQVar6;
      local_88.d.ptr = pcVar2;
      local_88.d.size = qVar5;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
    }
    if (name != AbsoluteName) goto LAB_001132e8;
LAB_00113290:
    QFileSystemEntry::filePath(&local_88,(QFileSystemEntry *)local_68);
    goto LAB_001132ed;
  case AbsoluteLinkTarget:
    QFileSystemEngine::getLinkTarget
              ((QFileSystemEntry *)local_68,(QFileSystemEngine *)&this->fileEntry,
               (QFileSystemEntry *)&this->metaData,
               (QFileSystemMetaData *)&switchD_00113240::switchdataD_00130500);
    break;
  case CanonicalName:
  case CanonicalPathName:
    local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEngine::canonicalName((QFileSystemEntry *)local_68,&this->fileEntry,&this->metaData);
    if (*(int *)&this->field_0x1d8 < 0) {
      QFileSystemEntry::filePath(&local_88,(QFileSystemEntry *)local_68);
      pQVar6 = &(this->fileNames[6].d.d)->super_QArrayData;
      pcVar2 = this->fileNames[6].d.ptr;
      this->fileNames[6].d.d = local_88.d.d;
      this->fileNames[6].d.ptr = local_88.d.ptr;
      qVar5 = this->fileNames[6].d.size;
      this->fileNames[6].d.size = local_88.d.size;
      local_88.d.d = (Data *)pQVar6;
      local_88.d.ptr = pcVar2;
      local_88.d.size = qVar5;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
      QFileSystemEntry::path(&local_88,(QFileSystemEntry *)local_68);
      pQVar6 = &(this->fileNames[7].d.d)->super_QArrayData;
      pcVar2 = this->fileNames[7].d.ptr;
      this->fileNames[7].d.d = local_88.d.d;
      this->fileNames[7].d.ptr = local_88.d.ptr;
      qVar5 = this->fileNames[7].d.size;
      this->fileNames[7].d.size = local_88.d.size;
      local_88.d.d = (Data *)pQVar6;
      local_88.d.ptr = pcVar2;
      local_88.d.size = qVar5;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
    }
    if (name == CanonicalName) goto LAB_00113290;
LAB_001132e8:
    QFileSystemEntry::path(&local_88,(QFileSystemEntry *)local_68);
LAB_001132ed:
    pQVar6 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_88.d.d;
    (__return_storage_ptr__->d).ptr = local_88.d.ptr;
    qVar5 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_88.d.size;
    local_88.d.ptr = pcVar2;
    local_88.d.size = qVar5;
    goto LAB_001133a4;
  case BundleName:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    goto LAB_0011340e;
  case JunctionName:
    QFileSystemEngine::getJunctionTarget
              ((QFileSystemEntry *)local_68,&this->fileEntry,&this->metaData);
    break;
  case RawLinkPath:
    QFileSystemEngine::getRawLinkPath
              ((QFileSystemEntry *)local_68,(QFileSystemEngine *)&this->fileEntry,
               (QFileSystemEntry *)&this->metaData,
               (QFileSystemMetaData *)&switchD_00113240::switchdataD_00130500);
    break;
  default:
    goto switchD_00113240_default;
  }
  QFileSystemEntry::filePath(&local_88,(QFileSystemEntry *)local_68);
  pQVar6 = &((__return_storage_ptr__->d).d)->super_QArrayData;
  pcVar2 = (__return_storage_ptr__->d).ptr;
  (__return_storage_ptr__->d).d = local_88.d.d;
  (__return_storage_ptr__->d).ptr = local_88.d.ptr;
  qVar5 = (__return_storage_ptr__->d).size;
  (__return_storage_ptr__->d).size = local_88.d.size;
  local_88.d.ptr = pcVar2;
  local_88.d.size = qVar5;
LAB_001133a4:
  local_88.d.d = (Data *)pQVar6;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  if ((QArrayData *)local_68._24_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._24_8_,1,0x10);
    }
  }
LAB_001133e9:
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
switchD_00113240_default:
  if ((__return_storage_ptr__->d).ptr == (char16_t *)0x0) {
LAB_0011340e:
    QString::operator=(__return_storage_ptr__,(QLatin1StringView)ZEXT816(0x1301c0));
  }
  if (*(int *)&this->field_0x1d8 < 0) {
    QString::operator=((QString *)&this->fileNames[(int)name].d,__return_storage_ptr__);
  }
LAB_00113443:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFileInfoPrivate::getFileName(QAbstractFileEngine::FileName name) const
{
    if (cache_enabled && !fileNames[(int)name].isNull())
        return fileNames[(int)name];

    QString ret;
    if (fileEngine == nullptr) { // local file; use the QFileSystemEngine directly
        switch (name) {
            case QAbstractFileEngine::CanonicalName:
            case QAbstractFileEngine::CanonicalPathName: {
                QFileSystemEntry entry = QFileSystemEngine::canonicalName(fileEntry, metaData);
                if (cache_enabled) { // be smart and store both
                    fileNames[QAbstractFileEngine::CanonicalName] = entry.filePath();
                    fileNames[QAbstractFileEngine::CanonicalPathName] = entry.path();
                }
                if (name == QAbstractFileEngine::CanonicalName)
                    ret = entry.filePath();
                else
                    ret = entry.path();
                break;
            }
            case QAbstractFileEngine::AbsoluteLinkTarget:
                ret = QFileSystemEngine::getLinkTarget(fileEntry, metaData).filePath();
                break;
            case QAbstractFileEngine::RawLinkPath:
                ret = QFileSystemEngine::getRawLinkPath(fileEntry, metaData).filePath();
                break;
            case QAbstractFileEngine::JunctionName:
                ret = QFileSystemEngine::getJunctionTarget(fileEntry, metaData).filePath();
                break;
            case QAbstractFileEngine::BundleName:
                ret = QFileSystemEngine::bundleName(fileEntry);
                break;
            case QAbstractFileEngine::AbsoluteName:
            case QAbstractFileEngine::AbsolutePathName: {
                QFileSystemEntry entry = QFileSystemEngine::absoluteName(fileEntry);
                if (cache_enabled) { // be smart and store both
                    fileNames[QAbstractFileEngine::AbsoluteName] = entry.filePath();
                    fileNames[QAbstractFileEngine::AbsolutePathName] = entry.path();
                }
                if (name == QAbstractFileEngine::AbsoluteName)
                    ret = entry.filePath();
                else
                    ret = entry.path();
                break;
            }
            default: break;
        }
    } else {
        ret = fileEngine->fileName(name);
    }
    if (ret.isNull())
        ret = ""_L1;
    if (cache_enabled)
        fileNames[(int)name] = ret;
    return ret;
}